

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::getOutFlowFaces
          (NavierStokesBase *this,
          Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *outFaces)

{
  long lVar1;
  int idir;
  long lVar2;
  
  lVar2 = 0;
  std::vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::resize
            (&outFaces->super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>,0);
  do {
    if (phys_bc.bc[lVar2] == 2) {
      lVar1 = ((long)(outFaces->
                     super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>).
                     super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(outFaces->super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                    ).super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                    _M_impl.super__Vector_impl_data._M_start) * 0x40000000;
      std::vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::resize
                (&outFaces->super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>,
                 lVar1 + 0x100000000 >> 0x20);
      *(int *)((long)&((outFaces->
                       super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>).
                       super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                       _M_impl.super__Vector_impl_data._M_start)->val + (lVar1 >> 0x1e)) =
           (int)lVar2;
    }
    if (phys_bc.bc[lVar2 + 3] == 2) {
      lVar1 = ((long)(outFaces->
                     super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>).
                     super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(outFaces->super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                    ).super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                    _M_impl.super__Vector_impl_data._M_start) * 0x40000000;
      std::vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::resize
                (&outFaces->super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>,
                 lVar1 + 0x100000000 >> 0x20);
      *(int *)((long)&((outFaces->
                       super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>).
                       super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                       _M_impl.super__Vector_impl_data._M_start)->val + (lVar1 >> 0x1e)) =
           (int)lVar2 + 3;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

void
NavierStokesBase::getOutFlowFaces (Vector<Orientation>& outFaces)
{
    outFaces.resize(0);
    for (int idir = 0; idir < AMREX_SPACEDIM; idir++)
    {
        if (phys_bc.lo(idir) == Outflow)
        {
            const int len = outFaces.size();
            outFaces.resize(len+1);
            outFaces[len] = Orientation(idir,Orientation::low);
        }

        if (phys_bc.hi(idir) == Outflow)
        {
            const int len = outFaces.size();
            outFaces.resize(len+1);
            outFaces[len] = Orientation(idir,Orientation::high);
        }
    }
}